

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void cpu_mips_store_status_mips(CPUMIPSState *env,target_ulong_conflict val)

{
  byte *pbVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = env->CP0_Status_rw_bitmask;
  if ((env->insn_flags & 0x2000) != 0) {
    uVar3 = uVar4 & 0xffffffe7;
    if ((~(uVar4 & val) & 0x18) != 0) {
      uVar3 = uVar4;
    }
    uVar4 = (~val | 0xffe7ffff) & uVar3;
  }
  env->CP0_Status = (val ^ env->CP0_Status) & uVar4 ^ env->CP0_Status;
  if ((env->CP0_Config3 & 4) != 0) {
    sync_c0_status_mips(env,env,env->current_tc);
    return;
  }
  uVar3 = env->hflags & 0xc8a7fd04;
  env->hflags = uVar3;
  uVar4 = env->CP0_Status;
  if ((uVar4 & 4) != 0) {
    env->hflags = uVar3 | 0x10000000;
  }
  if (((uVar4 & 6) == 0) && ((env->hflags & 4) == 0)) {
    env->hflags = env->hflags | uVar4 >> 3 & 3;
  }
  if ((((uVar4 >> 0x1c & 1) != 0) && ((env->insn_flags & 0x2000) == 0)) || ((env->hflags & 3) == 0))
  {
    *(byte *)&env->hflags = (byte)env->hflags | 0x10;
  }
  if ((uVar4 >> 0x1d & 1) != 0) {
    *(byte *)&env->hflags = (byte)env->hflags | 0x20;
  }
  if ((uVar4 >> 0x1a & 1) != 0) {
    *(byte *)&env->hflags = (byte)env->hflags | 0x40;
  }
  if (((env->hflags & 3) != 0) && ((env->CP0_Config5 & 0x40) != 0)) {
    env->hflags = env->hflags | 0x400000;
  }
  uVar2 = env->insn_flags;
  if ((uVar2 >> 0x25 & 1) == 0) {
    if ((uVar2 >> 0x24 & 1) != 0) {
      uVar3 = 0x180000;
      goto LAB_007553a9;
    }
    uVar3 = 0x80000;
    if ((uVar4 >> 0x18 & 1) != 0 && (uVar2 >> 0x23 & 1) != 0) goto LAB_007553af;
  }
  else {
    uVar3 = 0x20180000;
LAB_007553a9:
    if ((uVar4 >> 0x18 & 1) != 0) {
LAB_007553af:
      env->hflags = env->hflags | uVar3;
    }
  }
  if ((uVar2 & 0x40) == 0) {
    if ((uVar2 & 0x20) == 0) {
      if (-1 < (int)uVar4 || (uVar2 & 8) == 0) goto LAB_007553f6;
      goto LAB_007553d9;
    }
    uVar4 = env->hflags;
    if ((uVar4 & 8) == 0) goto LAB_007553f6;
  }
  else {
    if (((env->active_fpu).fcr0 & 0x400000) == 0) goto LAB_007553f6;
LAB_007553d9:
    uVar4 = env->hflags;
  }
  env->hflags = uVar4 | 0x80;
LAB_007553f6:
  if (((uVar2 >> 0x29 & 1) != 0) && ((env->CP0_Config5 & 0x8000000) != 0)) {
    pbVar1 = (byte *)((long)&env->hflags + 3);
    *pbVar1 = *pbVar1 | 1;
  }
  if ((((env->active_fpu).fcr0 & 0x20000000) != 0) && ((env->CP0_Config5 & 0x100) != 0)) {
    pbVar1 = (byte *)((long)&env->hflags + 3);
    *pbVar1 = *pbVar1 | 2;
  }
  if (((env->CP0_Config3 & 0x80) != 0) && ((env->CP0_PageGrain & 0x20000000) != 0)) {
    pbVar1 = (byte *)((long)&env->hflags + 3);
    *pbVar1 = *pbVar1 | 4;
  }
  return;
}

Assistant:

void cpu_mips_store_status(CPUMIPSState *env, target_ulong val)
{
    uint32_t mask = env->CP0_Status_rw_bitmask;
    target_ulong old = env->CP0_Status;

    if (env->insn_flags & ISA_MIPS32R6) {
        bool has_supervisor = extract32(mask, CP0St_KSU, 2) == 0x3;
#if defined(TARGET_MIPS64)
        uint32_t ksux = (1 << CP0St_KX) & val;
        ksux |= (ksux >> 1) & val; /* KX = 0 forces SX to be 0 */
        ksux |= (ksux >> 1) & val; /* SX = 0 forces UX to be 0 */
        val = (val & ~(7 << CP0St_UX)) | ksux;
#endif
        if (has_supervisor && extract32(val, CP0St_KSU, 2) == 0x3) {
            mask &= ~(3 << CP0St_KSU);
        }
        mask &= ~(((1 << CP0St_SR) | (1 << CP0St_NMI)) & val);
    }

    env->CP0_Status = (old & ~mask) | (val & mask);
#if defined(TARGET_MIPS64)
    if ((env->CP0_Status ^ old) & (old & (7 << CP0St_UX))) {
        /* Access to at least one of the 64-bit segments has been disabled */
        tlb_flush(env_cpu(env));
    }
#endif
    if (env->CP0_Config3 & (1 << CP0C3_MT)) {
        sync_c0_status(env, env, env->current_tc);
    } else {
        compute_hflags(env);
    }
}